

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

bool PartStream_BlockCheck(TBlockStream *pStream,ULONGLONG BlockOffset)

{
  PPART_FILE_MAP_ENTRY FileBitmap;
  ULONGLONG BlockOffset_local;
  TBlockStream *pStream_local;
  
  if ((BlockOffset & pStream->BlockSize - 1) != 0) {
    __assert_fail("(BlockOffset & (pStream->BlockSize - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x62c,"bool PartStream_BlockCheck(TBlockStream *, ULONGLONG)");
  }
  if (pStream->FileBitmap != (void *)0x0) {
    return (bool)(-((*(byte *)((long)pStream->FileBitmap + (BlockOffset / pStream->BlockSize) * 0x14
                              ) & 3) != 0) & 1);
  }
  __assert_fail("pStream->FileBitmap != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                ,0x62d,"bool PartStream_BlockCheck(TBlockStream *, ULONGLONG)");
}

Assistant:

static bool PartStream_BlockCheck(
    TBlockStream * pStream,                // Pointer to an open stream
    ULONGLONG BlockOffset)
{
    PPART_FILE_MAP_ENTRY FileBitmap;

    // Sanity checks
    assert((BlockOffset & (pStream->BlockSize - 1)) == 0);
    assert(pStream->FileBitmap != NULL);

    // Calculate the block map entry
    FileBitmap = (PPART_FILE_MAP_ENTRY)pStream->FileBitmap + (BlockOffset / pStream->BlockSize);

    // Check if the flags are present
    return (FileBitmap->Flags & 0x03) ? true : false;
}